

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

AssignmentPatternExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AssignmentPatternExpressionSyntax,slang::syntax::DataTypeSyntax*&,slang::syntax::AssignmentPatternSyntax&>
          (BumpAllocator *this,DataTypeSyntax **args,AssignmentPatternSyntax *args_1)

{
  DataTypeSyntax *pDVar1;
  AssignmentPatternExpressionSyntax *pAVar2;
  
  pAVar2 = (AssignmentPatternExpressionSyntax *)allocate(this,0x28,8);
  pDVar1 = *args;
  (pAVar2->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
       AssignmentPatternExpression;
  (pAVar2->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent =
       (SyntaxNode *)0x0;
  (pAVar2->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (SyntaxNode *)0x0;
  pAVar2->type = pDVar1;
  (pAVar2->pattern).ptr = args_1;
  if (pDVar1 != (DataTypeSyntax *)0x0) {
    (pDVar1->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)pAVar2;
  }
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pAVar2;
  return pAVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }